

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

string * __thiscall
mocker::ir::Interpreter::deleteComments
          (string *__return_storage_ptr__,Interpreter *this,string *source)

{
  bool bVar1;
  reference pcVar2;
  allocator<char> local_99;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  string local_88 [32];
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  Iter local_60;
  Iter local_58;
  char *local_50;
  Iter strEnd;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  const_iterator iter;
  string *source_local;
  Interpreter *this_local;
  string *res;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::push_back((char)source);
  local_40._M_current = (char *)std::__cxx11::string::cbegin();
  while( true ) {
    strEnd._M_current = (char *)std::__cxx11::string::end();
    bVar1 = __gnu_cxx::operator!=
                      (&local_40,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&strEnd);
    if (!bVar1) break;
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_40);
    if (*pcVar2 == '\"') {
      local_58._M_current = local_40._M_current;
      local_68._M_current = (char *)std::__cxx11::string::end();
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_60,&local_68);
      local_98._M_current = (char *)readStringLiteral(this,local_58,local_60);
      local_90._M_current = local_40._M_current;
      local_50 = local_98._M_current;
      std::allocator<char>::allocator();
      std::__cxx11::string::
      string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                (local_88,local_90,local_98,&local_99);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_88);
      std::__cxx11::string::~string(local_88);
      std::allocator<char>::~allocator(&local_99);
      local_40._M_current = local_50;
    }
    else {
      pcVar2 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_40);
      if (*pcVar2 == ';') {
        while (pcVar2 = __gnu_cxx::
                        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator*(&local_40), *pcVar2 != '\n') {
          __gnu_cxx::
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++(&local_40);
        }
      }
      else {
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator*(&local_40);
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&local_40);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Interpreter::deleteComments(std::string source) const {
  std::string res;

  source.push_back('\n');
  auto iter = source.cbegin();
  while (iter != source.end()) {
    if (*iter == '\"') {
      auto strEnd = readStringLiteral(iter, source.end());
      res += std::string(iter, strEnd);
      iter = strEnd;
      continue;
    }
    if (*iter != ';') {
      res.push_back(*iter);
      ++iter;
      continue;
    }
    while (*iter != '\n')
      ++iter;
  }

  return res;
}